

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_utils.cc
# Opt level: O2

void draco::ConvertSymbolsToSignedInts(uint32_t *in,int in_values,int32_t *out)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)in_values;
  if (in_values < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    out[uVar1] = -(in[uVar1] & 1) ^ in[uVar1] >> 1;
  }
  return;
}

Assistant:

void ConvertSymbolsToSignedInts(const uint32_t *in, int in_values,
                                int32_t *out) {
  for (int i = 0; i < in_values; ++i) {
    out[i] = ConvertSymbolToSignedInt(in[i]);
  }
}